

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCursor(Btree *p,int iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  undefined4 local_2c;
  int rc;
  BtCursor *pCur_local;
  KeyInfo *pKeyInfo_local;
  int wrFlag_local;
  int iTable_local;
  Btree *p_local;
  
  if (iTable < 1) {
    local_2c = sqlite3CorruptError(0xf63c);
  }
  else {
    sqlite3BtreeEnter(p);
    local_2c = btreeCursor(p,iTable,wrFlag,pKeyInfo,pCur);
    sqlite3BtreeLeave(p);
  }
  return local_2c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCursor(
  Btree *p,                                   /* The btree */
  int iTable,                                 /* Root page of table to open */
  int wrFlag,                                 /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,                   /* First arg to xCompare() */
  BtCursor *pCur                              /* Write new cursor here */
){
  int rc;
  if( iTable<1 ){
    rc = SQLITE_CORRUPT_BKPT;
  }else{
    sqlite3BtreeEnter(p);
    rc = btreeCursor(p, iTable, wrFlag, pKeyInfo, pCur);
    sqlite3BtreeLeave(p);
  }
  return rc;
}